

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void __thiscall
kj::UnixEventPort::ChildExitPromiseAdapter::ChildExitPromiseAdapter
          (ChildExitPromiseAdapter *this,PromiseFulfiller<int> *fulfiller,ChildSet *childSet,
          Maybe<int> *pidRef)

{
  pair<std::_Rb_tree_iterator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_bool>
  pVar1;
  Fault f;
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 local_18 [2];
  ChildExitPromiseAdapter *local_10;
  
  this->childSet = childSet;
  if ((pidRef->ptr).isSet == false) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
              ((Fault *)local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x80,FAILED,"pidRef != nullptr",
               "\"`pid` must be non-null at the time `onChildExit()` is called\"",
               (char (*) [61])"`pid` must be non-null at the time `onChildExit()` is called");
    _::Debug::Fault::fatal((Fault *)local_18);
  }
  local_18[0] = (pidRef->ptr).field_1;
  this->pid = (pid_t)local_18[0];
  this->pidRef = pidRef;
  this->fulfiller = fulfiller;
  local_10 = this;
  pVar1 = std::
          _Rb_tree<int,std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>,std::_Select1st<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>,std::less<int>,std::allocator<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>>
          ::_M_emplace_unique<std::pair<int,kj::UnixEventPort::ChildExitPromiseAdapter*>>
                    ((_Rb_tree<int,std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>,std::_Select1st<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>,std::less<int>,std::allocator<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>>
                      *)childSet,(pair<int,_kj::UnixEventPort::ChildExitPromiseAdapter_*> *)local_18
                    );
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
            ((Fault *)local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x83,FAILED,"childSet.waiters.insert(std::make_pair(pid, this)).second",
             "\"already called onChildExit() for this pid\"",
             (char (*) [42])"already called onChildExit() for this pid");
  _::Debug::Fault::fatal((Fault *)local_18);
}

Assistant:

inline ChildExitPromiseAdapter(PromiseFulfiller<int>& fulfiller,
                                 ChildSet& childSet, Maybe<pid_t>& pidRef)
      : childSet(childSet),
        pid(KJ_REQUIRE_NONNULL(pidRef,
            "`pid` must be non-null at the time `onChildExit()` is called")),
        pidRef(pidRef), fulfiller(fulfiller) {
    KJ_REQUIRE(childSet.waiters.insert(std::make_pair(pid, this)).second,
        "already called onChildExit() for this pid");
  }